

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NS_derive.cpp
# Opt level: O2

void derive_functions::derkeng
               (Box *bx,FArrayBox *derfab,int dcomp,int ncomp,FArrayBox *datfab,Geometry *param_6,
               Real param_7,int *param_8,int param_9)

{
  double dVar1;
  double dVar2;
  double dVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  double *pdVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  long lVar17;
  long lVar18;
  long lVar19;
  long lVar20;
  long lVar21;
  long lVar22;
  long lVar23;
  long lVar24;
  long lVar25;
  long lVar26;
  
  iVar4 = (datfab->super_BaseFab<double>).domain.smallend.vect[1];
  lVar22 = (long)iVar4;
  iVar5 = (datfab->super_BaseFab<double>).domain.smallend.vect[2];
  lVar25 = (long)iVar5;
  lVar9 = (long)(((datfab->super_BaseFab<double>).domain.bigend.vect[1] - iVar4) + 1);
  lVar21 = (long)(((datfab->super_BaseFab<double>).domain.bigend.vect[2] - iVar5) + 1);
  iVar4 = (derfab->super_BaseFab<double>).domain.smallend.vect[0];
  iVar5 = (derfab->super_BaseFab<double>).domain.smallend.vect[1];
  iVar6 = (derfab->super_BaseFab<double>).domain.smallend.vect[2];
  lVar10 = (long)(((derfab->super_BaseFab<double>).domain.bigend.vect[0] - iVar4) + 1);
  lVar16 = (long)(((derfab->super_BaseFab<double>).domain.bigend.vect[1] - iVar5) + 1);
  lVar14 = (long)(bx->smallend).vect[2];
  iVar7 = (bx->smallend).vect[0];
  lVar19 = (long)iVar7;
  lVar15 = (long)(bx->smallend).vect[1];
  lVar11 = ((lVar14 * 8 +
             (long)dcomp *
             (long)(((derfab->super_BaseFab<double>).domain.bigend.vect[2] - iVar6) + 1) * 8 +
            (long)iVar6 * -8) * lVar16 + lVar15 * 8 + (long)iVar5 * -8) * lVar10 + lVar19 * 8 +
           (long)iVar4 * -8 + (long)(derfab->super_BaseFab<double>).dptr;
  pdVar8 = (datfab->super_BaseFab<double>).dptr;
  iVar4 = (datfab->super_BaseFab<double>).domain.smallend.vect[0];
  lVar23 = (long)iVar4;
  lVar18 = (long)(((datfab->super_BaseFab<double>).domain.bigend.vect[0] - iVar4) + 1);
  iVar4 = (bx->bigend).vect[0];
  lVar12 = ((lVar21 * 0x18 + lVar14 * 8 + lVar25 * -8) * lVar9 + lVar15 * 8 + lVar22 * -8) * lVar18
           + lVar19 * 8 + lVar23 * -8 + (long)pdVar8;
  lVar17 = (lVar15 * 8 + (lVar21 * 0x10 + lVar14 * 8 + lVar25 * -8) * lVar9 + lVar22 * -8) * lVar18
           + lVar19 * 8 + lVar23 * -8 + (long)pdVar8;
  lVar21 = ((lVar21 * 8 + lVar14 * 8 + lVar25 * -8) * lVar9 + lVar15 * 8 + lVar22 * -8) * lVar18 +
           lVar19 * 8 + lVar23 * -8 + (long)pdVar8;
  lVar19 = (lVar15 * 8 + (lVar14 - lVar25) * lVar9 * 8 + lVar22 * -8) * lVar18 + lVar19 * 8 +
           lVar23 * -8 + (long)pdVar8;
  iVar5 = (bx->bigend).vect[1];
  iVar6 = (bx->bigend).vect[2];
  lVar9 = lVar9 * lVar18 * 8;
  lVar18 = lVar18 * 8;
  for (; lVar22 = lVar12, lVar23 = lVar15, lVar25 = lVar17, lVar20 = lVar11, lVar24 = lVar21,
      lVar26 = lVar19, lVar14 <= iVar6; lVar14 = lVar14 + 1) {
    for (; lVar23 <= iVar5; lVar23 = lVar23 + 1) {
      if (iVar7 <= iVar4) {
        lVar13 = 0;
        do {
          dVar1 = *(double *)(lVar24 + lVar13 * 8);
          dVar2 = *(double *)(lVar25 + lVar13 * 8);
          dVar3 = *(double *)(lVar22 + lVar13 * 8);
          *(double *)(lVar20 + lVar13 * 8) =
               (dVar3 * dVar3 + dVar1 * dVar1 + dVar2 * dVar2) *
               *(double *)(lVar26 + lVar13 * 8) * 0.5;
          lVar13 = lVar13 + 1;
        } while ((iVar4 - iVar7) + 1 != (int)lVar13);
      }
      lVar22 = lVar22 + lVar18;
      lVar25 = lVar25 + lVar18;
      lVar20 = lVar20 + lVar10 * 8;
      lVar24 = lVar24 + lVar18;
      lVar26 = lVar26 + lVar18;
    }
    lVar11 = lVar11 + lVar16 * lVar10 * 8;
    lVar12 = lVar12 + lVar9;
    lVar17 = lVar17 + lVar9;
    lVar21 = lVar21 + lVar9;
    lVar19 = lVar19 + lVar9;
  }
  return;
}

Assistant:

void derkeng (const Box& bx, FArrayBox& derfab, int dcomp, int ncomp,
		const FArrayBox& datfab, const Geometry& /*geomdata*/,
		Real /*time*/, const int* /*bcrec*/, int /*level*/)

  {
    AMREX_ASSERT(derfab.box().contains(bx));
    AMREX_ASSERT(Box(datfab.box()).contains(bx));
    AMREX_ASSERT(derfab.nComp() >= dcomp + ncomp);
    AMREX_ASSERT(datfab.nComp() >= 1);
    AMREX_ASSERT(ncomp == 1);
    auto const in_dat = datfab.array();
    auto          der = derfab.array(dcomp);

    amrex::ParallelFor(bx,[=] AMREX_GPU_DEVICE (int i, int j, int k) noexcept
    {
      const Real rho = in_dat(i,j,k,0);
      const Real vx  = in_dat(i,j,k,1);
      const Real vy  = in_dat(i,j,k,2);
#if (AMREX_SPACEDIM ==3)
      const Real vz  = in_dat(i,j,k,3);
#endif

      der(i,j,k) =  0.5 * rho * ( vx*vx + vy*vy
#if (AMREX_SPACEDIM == 3 )
				  + vz*vz
#endif
				  );
    });
  }